

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

void on_data(intptr_t sockfd,fio_protocol_s *ws_)

{
  _func_void_intptr_t_fio_protocol_s_ptr *p_Var1;
  ssize_t sVar2;
  _func_uint8_t_intptr_t_fio_protocol_s_ptr *p_Var3;
  websocket_packet_info_s wVar4;
  buffer_s bVar5;
  ssize_t len;
  _func_void_intptr_t_fio_protocol_s_ptr *local_40;
  uint64_t raw_length;
  websocket_packet_info_s info;
  ws_s *ws;
  fio_protocol_s *ws__local;
  intptr_t sockfd_local;
  
  if (ws_ != (fio_protocol_s *)0x0) {
    wVar4 = websocket_buffer_peek(ws_[3].on_data,(uint64_t)ws_[3].on_shutdown);
    raw_length = wVar4.packet_length;
    info.packet_length._0_1_ = wVar4.head_length;
    p_Var1 = (_func_void_intptr_t_fio_protocol_s_ptr *)(raw_length + (byte)info.packet_length);
    if (ws_[2].on_ready < p_Var1) {
      websocket_close((ws_s *)ws_);
    }
    else {
      if (ws_[3].on_ready < p_Var1) {
        ws_[3].on_ready = p_Var1;
        bVar5.data = ws_[3].on_data;
        bVar5.size = (size_t)ws_[3].on_ready;
        bVar5 = resize_ws_buffer((ws_s *)ws_,bVar5);
        len = (ssize_t)bVar5.data;
        ws_[3].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)len;
        local_40 = (_func_void_intptr_t_fio_protocol_s_ptr *)bVar5.size;
        ws_[3].on_ready = local_40;
        if (ws_[3].on_data == (_func_void_intptr_t_fio_protocol_s_ptr *)0x0) {
          websocket_close((ws_s *)ws_);
          return;
        }
      }
      sVar2 = fio_read(sockfd,ws_[3].on_shutdown + (long)ws_[3].on_data,
                       (long)ws_[3].on_ready - (long)ws_[3].on_shutdown);
      if (0 < sVar2) {
        p_Var3 = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)
                 websocket_consume(ws_[3].on_data,(uint64_t)(ws_[3].on_shutdown + sVar2),ws_,
                                   (*(byte *)((long)&ws_[3].ping + 1) ^ 0xff) & 1);
        ws_[3].on_shutdown = p_Var3;
        fio_force_event(sockfd,FIO_EVENT_ON_DATA);
      }
    }
  }
  return;
}

Assistant:

static void on_data(intptr_t sockfd, fio_protocol_s *ws_) {
  ws_s *const ws = (ws_s *)ws_;
  if (ws == NULL)
    return;
  struct websocket_packet_info_s info =
      websocket_buffer_peek(ws->buffer.data, ws->length);
  const uint64_t raw_length = info.packet_length + info.head_length;
  /* test expected data amount */
  if (ws->max_msg_size < raw_length) {
    /* too big */
    websocket_close(ws);
    return;
  }
  /* test buffer capacity */
  if (raw_length > ws->buffer.size) {
    ws->buffer.size = (size_t)raw_length;
    ws->buffer = resize_ws_buffer(ws, ws->buffer);
    if (!ws->buffer.data) {
      // no memory.
      websocket_close(ws);
      return;
    }
  }

  const ssize_t len = fio_read(sockfd, (uint8_t *)ws->buffer.data + ws->length,
                               ws->buffer.size - ws->length);
  if (len <= 0) {
    return;
  }
  ws->length = websocket_consume(ws->buffer.data, ws->length + len, ws,
                                 (~(ws->is_client) & 1));

  fio_force_event(sockfd, FIO_EVENT_ON_DATA);
}